

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

bool __thiscall
argstest::ArgumentParser::AddCompletionReply(ArgumentParser *this,string *cur,string *choice)

{
  CompletionFlag *pCVar1;
  int iVar2;
  OptionType OVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((cur->_M_string_length != 0) &&
     (lVar4 = std::__cxx11::string::find((char *)choice,(ulong)(cur->_M_dataplus)._M_p,0),
     lVar4 != 0)) {
    return false;
  }
  iVar2 = std::__cxx11::string::compare((char *)&this->completion->syntax);
  if (((iVar2 == 0) && (OVar3 = ParseOption(this,choice,false), OVar3 == LongFlag)) &&
     (lVar4 = std::__cxx11::string::find
                        ((char *)choice,(ulong)(this->longseparator)._M_dataplus._M_p,0),
     lVar4 != -1)) {
    pCVar1 = this->completion;
    std::__cxx11::string::find((char *)choice,(ulong)(this->longseparator)._M_dataplus._M_p,0);
    std::__cxx11::string::substr((ulong)&local_38,(ulong)choice);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pCVar1->reply,
               &local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->completion->reply,choice);
  }
  return true;
}

Assistant:

bool AddCompletionReply(const std::string &cur, const std::string &choice)
            {
                if (cur.empty() || choice.find(cur) == 0)
                {
                    if (completion->syntax == "bash" && ParseOption(choice) == OptionType::LongFlag && choice.find(longseparator) != std::string::npos)
                    {
                        completion->reply.push_back(choice.substr(choice.find(longseparator) + 1));
                    } else
                    {
                        completion->reply.push_back(choice);
                    }
                    return true;
                }

                return false;
            }